

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

INTBOOL CheckActorFlag(AActor *owner,char *flagname,bool printerror)

{
  INTBOOL IVar1;
  char *in_RAX;
  char *pcVar2;
  PClass *type;
  FFlagDef *fd;
  FString part1;
  
  part1.Chars = in_RAX;
  pcVar2 = strchr(flagname,0x2e);
  type = DObject::GetClass((DObject *)owner);
  if (pcVar2 == (char *)0x0) {
    fd = FindFlag(type,flagname,(char *)0x0);
  }
  else {
    FString::FString(&part1,flagname,(long)pcVar2 - (long)flagname);
    fd = FindFlag(type,part1.Chars,pcVar2 + 1);
    FString::~FString(&part1);
  }
  if (fd == (FFlagDef *)0x0) {
    IVar1 = 0;
    if (printerror) {
      IVar1 = 0;
      Printf("Unknown flag \'%s\' in \'%s\'\n",flagname,
             FName::NameData.NameArray[(type->super_PStruct).super_PNamedType.TypeName.Index].Text);
    }
  }
  else {
    IVar1 = CheckActorFlag(owner,fd);
  }
  return IVar1;
}

Assistant:

INTBOOL CheckActorFlag(const AActor *owner, const char *flagname, bool printerror)
{
	const char *dot = strchr (flagname, '.');
	FFlagDef *fd;
	const PClass *cls = owner->GetClass();

	if (dot != NULL)
	{
		FString part1(flagname, dot-flagname);
		fd = FindFlag (cls, part1, dot+1);
	}
	else
	{
		fd = FindFlag (cls, flagname, NULL);
	}

	if (fd != NULL)
	{
		return CheckActorFlag(owner, fd);
	}
	else
	{
		if (printerror) Printf("Unknown flag '%s' in '%s'\n", flagname, cls->TypeName.GetChars());
		return false;
	}
}